

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int write_hdr_to_file(nifti_1_header *nhdr,char *fname)

{
  int use_compression;
  bool bVar1;
  uint local_4c;
  char acStack_48 [4];
  int rv;
  char func [18];
  size_t bytes;
  znzFile fp;
  char *fname_local;
  nifti_1_header *nhdr_local;
  
  builtin_strncpy(acStack_48,"writ",4);
  rv._0_1_ = 'e';
  rv._1_1_ = '_';
  rv._2_1_ = 'h';
  rv._3_1_ = 'd';
  builtin_strncpy(func,"r_to_file",10);
  fp = (znzFile)fname;
  fname_local = (char *)nhdr;
  use_compression = nifti_is_gzfile(fname);
  bytes = (size_t)znzopen(fname,"r+b",use_compression);
  if ((znzFile)bytes == (znzFile)0x0) {
    fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",acStack_48,"failed to re-open mod file",fp);
    nhdr_local._4_4_ = 1;
  }
  else {
    register0x00000000 = znzwrite(fname_local,1,0x15c,(znzFile)bytes);
    bVar1 = register0x00000000 != 0x15c;
    if (bVar1) {
      fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",acStack_48,"failed to write header to file",fp);
      fprintf(_stderr,"  - wrote %d of %d bytes\n",stack0xffffffffffffffd0 & 0xffffffff,0x15c);
    }
    local_4c = (uint)bVar1;
    if (3 < g_debug) {
      disp_nifti_1_header("+d writing new header to file : ",(nifti_1_header *)fname_local);
    }
    Xznzclose((znzFile *)&bytes);
    nhdr_local._4_4_ = local_4c;
  }
  return nhdr_local._4_4_;
}

Assistant:

int write_hdr_to_file( nifti_1_header * nhdr, char * fname )
{
   znzFile fp;
   size_t  bytes;
   char    func[] = { "write_hdr_to_file" };
   int     rv = 0;

   fp = znzopen(fname,"r+b",nifti_is_gzfile(fname));
   if( znz_isnull(fp) ){
      NTL_FERR(func, "failed to re-open mod file", fname);
      return 1;
   }

   bytes = znzwrite(nhdr, 1, sizeof(nifti_1_header), fp);
   if( bytes != sizeof(nifti_1_header)){
      NTL_FERR(func, "failed to write header to file",fname);
      fprintf(stderr,"  - wrote %d of %d bytes\n",
              (int)bytes,(int)sizeof(nifti_1_header));
      rv = 1;
   }

   if( g_debug > 3 )
      disp_nifti_1_header("+d writing new header to file : ", nhdr);

   znzclose(fp);

   return rv;
}